

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionGraph::make_rewind_exec
          (InstructionGraph *this,InstructionMark *mark,InstructionRewind *rewind)

{
  Instruction *pIVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  Transition *pTVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar6;
  uint *val;
  pointer ppVar7;
  Vec<Hpipe::Transition> *this_01;
  PathsToStrings *this_02;
  reference __x;
  size_type sVar8;
  bool local_271;
  Instruction *local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>
  *mp;
  iterator __end1;
  iterator __begin1;
  PathsToStrings *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  Vec<unsigned_int> local_1d0;
  Transition local_1b8;
  byte local_189;
  Vec<unsigned_int> local_188;
  _Self local_170;
  Instruction *local_168;
  Instruction *new_inst;
  Vec<unsigned_int> local_158;
  _Self local_140;
  iterator iter;
  iterator iStack_130;
  uint keep_ind_next;
  iterator __end2;
  iterator __begin2;
  Vec<unsigned_int> *__range2;
  Transition *t;
  Vec<unsigned_int> keep_ind;
  PendingRewindTrans pt;
  undefined1 local_d0 [8];
  anon_class_32_4_fc640c73 reg;
  undefined1 local_a0 [8];
  deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  pending_trans;
  map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  instruction_map;
  InstructionRewind *rewind_local;
  InstructionMark *mark_local;
  InstructionGraph *this_local;
  
  rewind_local = (InstructionRewind *)mark;
  mark_local = (InstructionMark *)this;
  std::
  map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  ::map((map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
         *)&pending_trans.
            super__Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::deque((deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
           *)local_a0);
  reg.this = (InstructionGraph *)
             &pending_trans.
              super__Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  reg.instruction_map =
       (map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
        *)&rewind_local;
  reg.mark = (InstructionMark **)local_a0;
  local_d0 = (undefined1  [8])this;
  sVar3 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::size
                    ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
                     &(rewind->super_Instruction).cx);
  range_vec<unsigned_int>((Vec<unsigned_int> *)&pt.num_prev,(uint)sVar3);
  make_rewind_exec::anon_class_32_4_fc640c73::operator()
            ((anon_class_32_4_fc640c73 *)local_d0,&rewind->super_Instruction,
             (Vec<unsigned_int> *)&pt.num_prev);
  Vec<unsigned_int>::~Vec((Vec<unsigned_int> *)&pt.num_prev);
  while (bVar2 = std::
                 deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
                 ::empty((deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
                          *)local_a0), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
             ::back((deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
                     *)local_a0);
    keep_ind.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)pvVar4->new_inst;
    pt.new_inst = *(Instruction **)&pvVar4->num_prev;
    std::
    deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
    ::pop_back((deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
                *)local_a0);
    Vec<unsigned_int>::Vec((Vec<unsigned_int> *)&t);
    pTVar5 = Vec<Hpipe::Transition>::operator[]
                       ((Vec<Hpipe::Transition> *)
                        (*(long *)(keep_ind.
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x34) + 0xb0)
                        ,(uint)pt.new_inst);
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (keep_ind.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x36);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    iStack_130 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffed0), bVar2) {
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      iter._M_node._4_4_ = *puVar6;
      val = Vec<unsigned_int>::operator[](&pTVar5->rcitem,iter._M_node._4_4_);
      Vec<unsigned_int>::push_back_unique<unsigned_int&>((Vec<unsigned_int> *)&t,val);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
    new_inst = pTVar5->inst;
    Vec<unsigned_int>::Vec(&local_158,(Vec<unsigned_int> *)&t);
    local_140._M_node =
         (_Base_ptr)
         std::
         map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
         ::find((map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
                 *)&pending_trans.
                    super__Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,(key_type *)&new_inst);
    RewindContext::~RewindContext((RewindContext *)&new_inst);
    local_170._M_node =
         (_Base_ptr)
         std::
         map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
         ::end((map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
                *)&pending_trans.
                   super__Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node);
    bVar2 = std::operator==(&local_140,&local_170);
    local_189 = 0;
    if (bVar2) {
      pIVar1 = pTVar5->inst;
      Vec<unsigned_int>::Vec(&local_188,(Vec<unsigned_int> *)&t);
      local_189 = 1;
      local_258 = make_rewind_exec::anon_class_32_4_fc640c73::operator()
                            ((anon_class_32_4_fc640c73 *)local_d0,pIVar1,&local_188);
    }
    else {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>
               ::operator->(&local_140);
      local_258 = ppVar7->second;
    }
    if ((local_189 & 1) != 0) {
      Vec<unsigned_int>::~Vec(&local_188);
    }
    local_168 = local_258;
    Vec<Hpipe::Vec<Hpipe::Transition>>::secure_push_back<Hpipe::Instruction*>
              ((Vec<Hpipe::Vec<Hpipe::Transition>> *)&local_258->next_rw,pt.new_inst._4_4_,
               (Instruction **)
               &keep_ind.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pIVar1 = local_168;
    this_01 = (Vec<Hpipe::Transition> *)
              (keep_ind.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x2c);
    Vec<unsigned_int>::Vec(&local_1d0);
    Transition::Transition(&local_1b8,pIVar1,&local_1d0,-1.0);
    Vec<Hpipe::Transition>::operator<<(this_01,&local_1b8);
    Transition::~Transition(&local_1b8);
    Vec<unsigned_int>::~Vec(&local_1d0);
    local_271 = false;
    if ((InstructionRewind *)pTVar5->inst == rewind_local) {
      Vec<unsigned_int>::uniqued
                ((Vec<unsigned_int> *)&local_1e8,&(rewind->super_Instruction).cx.paths_to_mark);
      local_271 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&t,
                                  &local_1e8);
      Vec<unsigned_int>::~Vec((Vec<unsigned_int> *)&local_1e8);
    }
    if (local_271 != false) {
      rewind->exec = local_168;
    }
    Vec<unsigned_int>::~Vec((Vec<unsigned_int> *)&t);
  }
  this_02 = &(rewind_local->super_Instruction).cx.paths_to_strings;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
           ::begin(this_02);
  mp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
          ::end(this_02);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&mp), bVar2) {
    __x = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>
          ::operator*(&__end1);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
            ::count(&(rewind->super_Instruction).cx.paths_to_strings,&__x->first);
    if (sVar8 == 0) {
      Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator<<(&rewind->strs_to_cancel,&__x->first);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  std::
  deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::~deque((deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
            *)local_a0);
  std::
  map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  ::~map((map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
          *)&pending_trans.
             super__Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return;
}

Assistant:

void InstructionGraph::make_rewind_exec( InstructionMark *mark, InstructionRewind *rewind ) {
    // we start from the end
    std::map<RewindContext,Instruction *> instruction_map; // [ orig, keep_ind ] => new instruction
    std::deque<PendingRewindTrans> pending_trans; //

    auto reg = [&]( Instruction *orig, Vec<unsigned> orig_keep_ind ) {
        Instruction *new_inst = orig->clone( inst_pool, orig->cx.keep_only( orig_keep_ind ).first.without_mark().first, orig_keep_ind );
        instruction_map[ RewindContext{ orig, orig_keep_ind } ] = new_inst;
        new_inst->running_strs = orig->running_strs;
        new_inst->orig_keed_ind = orig_keep_ind;
        new_inst->orig = orig;

        // look into prevs
        if ( orig != mark ) {
            std::set<Instruction *> prevs;
            for( unsigned num_prev = 0; num_prev < orig->prev.size(); ++num_prev ) {
                Instruction *prev = orig->prev[ num_prev ].inst;
                if ( prevs.count( prev ) )
                    continue;
                prevs.insert( prev );
                for( unsigned num_next = 0; num_next < prev->next.size(); ++num_next )
                    if ( prev->next[ num_next ].inst == orig )
                        pending_trans.emplace_back( new_inst, num_prev, num_next );
            }
        }

        return new_inst;
    };

    reg( rewind, range_vec( unsigned( rewind->cx.pos.size() ) ) );
    while ( ! pending_trans.empty() ) {
        PendingRewindTrans pt = pending_trans.back();
        pending_trans.pop_back();

        Vec<unsigned> keep_ind;
        Transition &t = pt.new_inst->orig->prev[ pt.num_prev ];
        for( unsigned keep_ind_next : pt.new_inst->orig_keed_ind )
            keep_ind.push_back_unique( t.rcitem[ keep_ind_next ] );

        // make the new instruction if not already done
        auto iter = instruction_map.find( RewindContext{ t.inst, keep_ind } );
        Instruction *new_inst = iter == instruction_map.end() ? reg( t.inst, keep_ind ) : iter->second;

        // std::cout << pt.new_inst->orig->get_display_id() << "\t->\t" << t.inst->get_display_id() << "\tki=[" << keep_ind << "]:\t" << new_inst->get_display_id() << "\t-> " << *new_inst << std::endl;

        // register in the graph
        new_inst->next_rw.secure_push_back( pt.num_next, pt.new_inst );
        pt.new_inst->prev << new_inst;

        //
        if ( t.inst == mark && keep_ind == rewind->cx.paths_to_mark.uniqued() )
            rewind->exec = new_inst;
    }

    // strings present in mark but not in rewind
    for( const auto &mp : mark->cx.paths_to_strings )
        if ( ! rewind->cx.paths_to_strings.count( mp.first ) )
            rewind->strs_to_cancel << mp.first;
}